

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers.c
# Opt level: O0

int ffpbytoff(fitsfile *fptr,long gsize,long ngroups,long offset,void *buffer,int *status)

{
  long lVar1;
  size_t local_90;
  size_t local_88;
  char *local_80;
  char *ioptr;
  char *cptr;
  long record;
  long nwrite;
  long nspace;
  long bufpos;
  long ii;
  int bcurrent;
  int *status_local;
  void *buffer_local;
  long offset_local;
  long ngroups_local;
  long gsize_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    if (fptr->HDUposition != fptr->Fptr->curhdu) {
      ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    }
    if (fptr->Fptr->curbuf < 0) {
      ffldrc(fptr,fptr->Fptr->bytepos / 0xb40,0,status);
    }
    ii._4_4_ = fptr->Fptr->curbuf;
    cptr = (char *)fptr->Fptr->bufrecnum[ii._4_4_];
    lVar1 = fptr->Fptr->bytepos + (long)cptr * -0xb40;
    nwrite = 0xb40 - lVar1;
    local_80 = fptr->Fptr->iobuffer + lVar1 + ii._4_4_ * 0xb40;
    ioptr = (char *)buffer;
    for (bufpos = 1; bufpos < ngroups; bufpos = bufpos + 1) {
      local_88 = gsize;
      if (nwrite <= gsize) {
        local_88 = nwrite;
      }
      memcpy(local_80,ioptr,local_88);
      ioptr = ioptr + local_88;
      if ((long)local_88 < gsize) {
        fptr->Fptr->dirty[ii._4_4_] = 1;
        cptr = cptr + 1;
        ffldrc(fptr,(long)cptr,1,status);
        ii._4_4_ = fptr->Fptr->curbuf;
        local_80 = fptr->Fptr->iobuffer + ii._4_4_ * 0xb40;
        local_88 = gsize - local_88;
        memcpy(local_80,ioptr,local_88);
        ioptr = ioptr + local_88;
        local_80 = local_80 + offset + local_88;
        nwrite = (0xb40 - offset) - local_88;
      }
      else {
        local_80 = local_80 + offset + local_88;
        nwrite = nwrite - (offset + local_88);
      }
      if (nwrite < 1) {
        fptr->Fptr->dirty[ii._4_4_] = 1;
        cptr = cptr + (0xb40 - nwrite) / 0xb40;
        ffldrc(fptr,(long)cptr,1,status);
        ii._4_4_ = fptr->Fptr->curbuf;
        lVar1 = -nwrite;
        nwrite = 0xb40 - lVar1 % 0xb40;
        local_80 = fptr->Fptr->iobuffer + lVar1 % 0xb40 + (long)(ii._4_4_ * 0xb40);
      }
    }
    local_90 = gsize;
    if (nwrite <= gsize) {
      local_90 = nwrite;
    }
    memcpy(local_80,ioptr,local_90);
    if ((long)local_90 < gsize) {
      fptr->Fptr->dirty[ii._4_4_] = 1;
      ffldrc(fptr,(long)(cptr + 1),1,status);
      ii._4_4_ = fptr->Fptr->curbuf;
      memcpy(fptr->Fptr->iobuffer + ii._4_4_ * 0xb40,ioptr + local_90,gsize - local_90);
    }
    fptr->Fptr->dirty[ii._4_4_] = 1;
    fptr->Fptr->bytepos = fptr->Fptr->bytepos + ngroups * gsize + (ngroups + -1) * offset;
    fptr_local._4_4_ = *status;
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffpbytoff(fitsfile *fptr, /* I - FITS file pointer                   */
           long gsize,        /* I - size of each group of bytes         */
           long ngroups,      /* I - number of groups to write           */
           long offset,       /* I - size of gap between groups          */
           void *buffer,      /* I - buffer to be written                */
           int *status)       /* IO - error status                       */
/*
  put (write) the buffer of bytes to the output FITS file, with an offset
  between each group of bytes.  This function combines ffmbyt and ffpbyt
  for increased efficiency.
*/
{
    int bcurrent;
    long ii, bufpos, nspace, nwrite, record;
    char *cptr, *ioptr;

    if (*status > 0)
       return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if ((fptr->Fptr)->curbuf < 0)  /* no current data buffer for this file */
    {                              /* so reload the last one that was used */
      ffldrc(fptr, (long) (((fptr->Fptr)->bytepos) / IOBUFLEN), REPORT_EOF, status);
    }

    cptr = (char *)buffer;
    bcurrent = (fptr->Fptr)->curbuf;     /* number of the current IO buffer */
    record = (fptr->Fptr)->bufrecnum[bcurrent];  /* zero-indexed record number */
    bufpos = (long) ((fptr->Fptr)->bytepos - ((LONGLONG)record * IOBUFLEN)); /* start pos */
    nspace = IOBUFLEN - bufpos;  /* amount of space left in buffer */
    ioptr = (fptr->Fptr)->iobuffer + (bcurrent * IOBUFLEN) + bufpos;  

    for (ii = 1; ii < ngroups; ii++)  /* write all but the last group */
    {
      /* copy bytes from user's buffer to the IO buffer */
      nwrite = minvalue(gsize, nspace);
      memcpy(ioptr, cptr, nwrite);
      cptr += nwrite;          /* increment buffer pointer */

      if (nwrite < gsize)        /* entire group did not fit */
      {
        (fptr->Fptr)->dirty[bcurrent] = TRUE;  /* mark record as having been modified */
        record++;
        ffldrc(fptr, record, IGNORE_EOF, status);  /* load next record */
        bcurrent = (fptr->Fptr)->curbuf;
        ioptr   = (fptr->Fptr)->iobuffer + (bcurrent * IOBUFLEN);

        nwrite  = gsize - nwrite;
        memcpy(ioptr, cptr, nwrite);
        cptr   += nwrite;            /* increment buffer pointer */
        ioptr  += (offset + nwrite); /* increment IO buffer pointer */
        nspace = IOBUFLEN - offset - nwrite;  /* amount of space left */
      }
      else
      {
        ioptr  += (offset + nwrite);  /* increment IO bufer pointer */
        nspace -= (offset + nwrite);
      }

      if (nspace <= 0) /* beyond current record? */
      {
        (fptr->Fptr)->dirty[bcurrent] = TRUE;
        record += ((IOBUFLEN - nspace) / IOBUFLEN); /* new record number */
        ffldrc(fptr, record, IGNORE_EOF, status);
        bcurrent = (fptr->Fptr)->curbuf;

        bufpos = (-nspace) % IOBUFLEN; /* starting buffer pos */
        nspace = IOBUFLEN - bufpos;
        ioptr = (fptr->Fptr)->iobuffer + (bcurrent * IOBUFLEN) + bufpos;  
      }
    }
      
    /* now write the last group */
    nwrite = minvalue(gsize, nspace);
    memcpy(ioptr, cptr, nwrite);
    cptr += nwrite;          /* increment buffer pointer */

    if (nwrite < gsize)        /* entire group did not fit */
    {
      (fptr->Fptr)->dirty[bcurrent] = TRUE;  /* mark record as having been modified */
      record++;
      ffldrc(fptr, record, IGNORE_EOF, status);  /* load next record */
      bcurrent = (fptr->Fptr)->curbuf;
      ioptr   = (fptr->Fptr)->iobuffer + (bcurrent * IOBUFLEN);

      nwrite  = gsize - nwrite;
      memcpy(ioptr, cptr, nwrite);
    }

    (fptr->Fptr)->dirty[bcurrent] = TRUE;    /* mark record as having been modified */
    (fptr->Fptr)->bytepos = (fptr->Fptr)->bytepos + (ngroups * gsize)
                                  + (ngroups - 1) * offset;
    return(*status);
}